

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_math_minmax(jit_State *J,RecordFFData *rd)

{
  uint32_t uVar1;
  ushort local_5c;
  TRef local_58;
  IRType t;
  TRef tr2;
  BCReg i;
  uint32_t op;
  TRef tr;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  i = lj_ir_tonumber(J,*J->base);
  uVar1 = rd->data;
  for (t = IRT_FALSE; J->base[t] != 0; t = t + IRT_FALSE) {
    local_58 = lj_ir_tonumber(J,J->base[t]);
    local_5c = 0x13;
    if ((4 < (i >> 0x18 & 0x1f) - 0xf) || (4 < (local_58 >> 0x18 & 0x1f) - 0xf)) {
      if ((i >> 0x18 & 0x1f) - 0xf < 5) {
        (J->fold).ins.field_0.ot = 0x5b0e;
        (J->fold).ins.field_0.op1 = (IRRef1)i;
        (J->fold).ins.field_0.op2 = 0x1d3;
        i = lj_opt_fold(J);
      }
      if ((local_58 >> 0x18 & 0x1f) - 0xf < 5) {
        (J->fold).ins.field_0.ot = 0x5b0e;
        (J->fold).ins.field_0.op1 = (IRRef1)local_58;
        (J->fold).ins.field_0.op2 = 0x1d3;
        local_58 = lj_opt_fold(J);
      }
      local_5c = 0xe;
    }
    (J->fold).ins.field_0.ot = (ushort)(uVar1 << 8) | local_5c;
    (J->fold).ins.field_0.op1 = (IRRef1)i;
    (J->fold).ins.field_0.op2 = (IRRef1)local_58;
    i = lj_opt_fold(J);
  }
  *J->base = i;
  return;
}

Assistant:

static void LJ_FASTCALL recff_math_minmax(jit_State *J, RecordFFData *rd)
{
  TRef tr = lj_ir_tonumber(J, J->base[0]);
  uint32_t op = rd->data;
  BCReg i;
  for (i = 1; J->base[i] != 0; i++) {
    TRef tr2 = lj_ir_tonumber(J, J->base[i]);
    IRType t = IRT_INT;
    if (!(tref_isinteger(tr) && tref_isinteger(tr2))) {
      if (tref_isinteger(tr)) tr = emitir(IRTN(IR_CONV), tr, IRCONV_NUM_INT);
      if (tref_isinteger(tr2)) tr2 = emitir(IRTN(IR_CONV), tr2, IRCONV_NUM_INT);
      t = IRT_NUM;
    }
    tr = emitir(IRT(op, t), tr, tr2);
  }
  J->base[0] = tr;
}